

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall
slang::parsing::Lexer::create<slang::logic_t_const&>(Lexer *this,TokenKind kind,logic_t *args)

{
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  Token *extraout_RDX;
  undefined2 in_SI;
  char *in_RDI;
  string_view sVar2;
  SourceLocation location;
  Lexer *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  BufferID in_stack_ffffffffffffff74;
  Token *this_00;
  logic_t in_stack_ffffffffffffffbf;
  SourceLocation in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffe0;
  char *pcVar4;
  Token local_10;
  BumpAllocator *alloc;
  
  uVar3 = *(undefined4 *)(in_RDI + 0x50);
  pcVar4 = in_RDI;
  SourceLocation::SourceLocation
            ((SourceLocation *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff74,(uint64_t)in_stack_ffffffffffffff60);
  iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy
                    ((SmallVectorBase<slang::parsing::Trivia> *)(in_RDI + 0x80),
                     *(EVP_PKEY_CTX **)in_RDI,src);
  alloc = (BumpAllocator *)CONCAT44(extraout_var,iVar1);
  this_00 = extraout_RDX;
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
  span<slang::parsing::Trivia,_18446744073709551615UL>
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff74.id,in_stack_ffffffffffffff70),
             (span<slang::parsing::Trivia,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  sVar2 = lexeme(in_stack_ffffffffffffff60);
  trivia._M_ptr._4_4_ = uVar3;
  trivia._M_ptr._0_4_ = in_stack_ffffffffffffffc8;
  trivia._M_extent._M_extent_value = in_stack_ffffffffffffffd0._M_extent_value;
  rawText._M_len._6_2_ = in_SI;
  rawText._M_len._0_6_ = in_stack_ffffffffffffffe0;
  rawText._M_str = pcVar4;
  Token::Token(this_00,alloc,sVar2._M_str._6_2_,trivia,rawText,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbf);
  return local_10;
}

Assistant:

Token Lexer::create(TokenKind kind, Args&&... args) {
    SourceLocation location(bufferId, size_t(marker - originalBegin));
    return Token(alloc, kind, triviaBuffer.copy(alloc), lexeme(), location,
                 std::forward<Args>(args)...);
}